

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O2

Reg ra_scratch(ASMState *as,RegSet allow)

{
  Reg RVar1;
  
  RVar1 = ra_pick(as,allow);
  as->modset = as->modset | 1 << ((byte)RVar1 & 0x1f);
  return RVar1;
}

Assistant:

static Reg ra_scratch(ASMState *as, RegSet allow)
{
  Reg r = ra_pick(as, allow);
  ra_modified(as, r);
  RA_DBGX((as, "scratch        $r", r));
  return r;
}